

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

int Lodtalk::ScriptContext::stAddMethod(InterpreterProxy *interpreter)

{
  Node *ast;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar5;
  CompiledMethod *this;
  Oop OVar6;
  ClassDescription *pCVar7;
  Ref<Lodtalk::ClassDescription> clazz;
  VMContext *context;
  Ref<Lodtalk::CompiledMethod> compiledMethod;
  shared_ptr<Lodtalk::InstanceVariableScope> instanceVarScope;
  shared_ptr<Lodtalk::GlobalEvaluationScope> globalScope;
  anon_union_8_4_0eb573b0_for_Oop_0 local_a0 [4];
  VMContext *local_80;
  anon_union_8_4_0eb573b0_for_Oop_0 local_78 [4];
  __shared_ptr<Lodtalk::InstanceVariableScope,_(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  VMContext *pVVar4;
  
  iVar2 = (**interpreter->_vptr_InterpreterProxy)();
  pVVar4 = (VMContext *)CONCAT44(extraout_var,iVar2);
  local_80 = pVVar4;
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])(interpreter);
  if (CONCAT44(extraout_var_00,iVar2) == 1) {
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
    OVar6.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    OVar6.field_0.uintValue._4_4_ = extraout_var_02;
    if (OVar6.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) {
      std::__cxx11::string::string
                ((string *)local_a0,"cannot add method with nil ast.",(allocator *)local_78);
      nativeError((string *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
    }
    iVar3 = classIndexOf(OVar6);
    if (iVar3 != 0x66) {
      std::__cxx11::string::string
                ((string *)local_a0,"expected a method AST handle.",(allocator *)local_78);
      nativeError((string *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
    }
    bVar1 = VMContext::isClassOrMetaclass
                      (pVVar4,(Oop)*(anon_union_8_4_0eb573b0_for_Oop_0 *)
                                    (CONCAT44(extraout_var_01,iVar2) + 0x10));
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)local_a0,"a class is needed for adding a method.",(allocator *)local_78);
      nativeError((string *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
    }
    aVar5 = *(anon_union_8_4_0eb573b0_for_Oop_0 *)(CONCAT44(extraout_var_01,iVar2) + 0x10);
    OopRef::OopRef((OopRef *)local_a0,pVVar4);
    ast = *(Node **)((long)OVar6.field_0 + 8);
    local_a0[0] = aVar5;
    std::make_shared<Lodtalk::GlobalEvaluationScope,Lodtalk::VMContext*&>((VMContext **)local_48);
    std::
    make_shared<Lodtalk::InstanceVariableScope,std::shared_ptr<Lodtalk::GlobalEvaluationScope>&,Lodtalk::Ref<Lodtalk::ClassDescription>&>
              ((shared_ptr<Lodtalk::GlobalEvaluationScope> *)&local_58,
               (Ref<Lodtalk::ClassDescription> *)local_48);
    pVVar4 = local_80;
    std::__shared_ptr<Lodtalk::EvaluationScope,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Lodtalk::InstanceVariableScope,void>
              ((__shared_ptr<Lodtalk::EvaluationScope,(__gnu_cxx::_Lock_policy)2> *)
               (local_48 + 0x10),&local_58);
    aVar5.header = (ObjectHeader *)
                   compileMethod(pVVar4,(EvaluationScopePtr *)(local_48 + 0x10),
                                 (Ref<Lodtalk::ClassDescription> *)local_a0,ast);
    OopRef::OopRef((OopRef *)local_78,pVVar4);
    local_78[0].header = aVar5.header;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    this = Ref<Lodtalk::CompiledMethod>::operator->((Ref<Lodtalk::CompiledMethod> *)local_78);
    OVar6 = CompiledMethod::getSelector(this);
    pCVar7 = Ref<Lodtalk::ClassDescription>::operator->((Ref<Lodtalk::ClassDescription> *)local_a0);
    MethodDictionary::internalAtPut
              ((pCVar7->super_Behavior).methodDict,local_80,OVar6,(Oop)local_78[0]);
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x12])(interpreter);
    OopRef::~OopRef((OopRef *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    OopRef::~OopRef((OopRef *)local_a0);
    return iVar2;
  }
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar2;
}

Assistant:

int ScriptContext::stAddMethod(InterpreterProxy *interpreter)
{
    auto context = interpreter->getContext();
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();
    auto self = reinterpret_cast<ScriptContext*> (interpreter->getReceiver().pointer);
    auto methodAstHandle = interpreter->getTemporary(0);

	if(isNil(methodAstHandle))
		nativeError("cannot add method with nil ast.");
	if(classIndexOf(methodAstHandle) != SCI_MethodASTHandle)
		nativeError("expected a method AST handle.");

	// Check the class
	if(!context->isClassOrMetaclass(self->currentClass))
		nativeError("a class is needed for adding a method.");
	Ref<ClassDescription> clazz(context, reinterpret_cast<ClassDescription*> (self->currentClass.pointer));

	// Get the ast
	MethodASTHandle *handle = reinterpret_cast<MethodASTHandle*> (methodAstHandle.pointer);
	auto ast = handle->ast;

	// Create the global scope
	auto globalScope = std::make_shared<GlobalEvaluationScope> (context);

	// TODO: Create the class variables scope.

	// Create the class instance variables scope.
	auto instanceVarScope = std::make_shared<InstanceVariableScope> (globalScope, clazz);

	// Compile the method
	Ref<CompiledMethod> compiledMethod(context, compileMethod(context, instanceVarScope, clazz, ast));

	// Register the method in the current class
	auto selector = compiledMethod->getSelector();
	clazz->methodDict->atPut(context, selector, compiledMethod.getOop());

	// Return self
	return interpreter->returnReceiver();
}